

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlkem_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_83682d::MLKEMTest_Iterate768_Test::TestBody(MLKEMTest_Iterate768_Test *this)

{
  int iVar1;
  BCM_mlkem768_private_key *out_private_key;
  MLKEM768_public_key *out_public_key;
  MLKEM768_private_key *t;
  char *message;
  char *in_R9;
  int iVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> encoded_priv;
  uint8_t result [32];
  uint8_t shared_secret [32];
  uint8_t encap_entropy [32];
  BORINGSSL_keccak_st generate_st;
  uint8_t seed [64];
  BORINGSSL_keccak_st results_st;
  uint8_t ciphertext [1088];
  uint8_t invalid_ciphertext [1088];
  uint8_t kExpected [32];
  AssertHelper local_1030;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_1028;
  internal local_1020 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1018;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1010;
  string local_ff8;
  long local_fd8 [4];
  uint8_t local_fb8 [32];
  uint8_t local_f98 [40];
  AssertHelperData *local_f70;
  uint64_t local_f68;
  uint8_t local_e88 [72];
  BORINGSSL_keccak_st local_e40;
  internal local_d58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d50 [135];
  Bytes local_918 [68];
  AssertHelperData local_4d8 [21];
  
  BORINGSSL_keccak_init((BORINGSSL_keccak_st *)&local_f70,boringssl_shake128);
  BORINGSSL_keccak_init(&local_e40,boringssl_shake128);
  out_private_key = (BCM_mlkem768_private_key *)operator_new(0x1e60);
  memset(out_private_key,0,0x1e60);
  out_public_key = (MLKEM768_public_key *)operator_new(0x1840);
  memset(out_public_key,0,0x1840);
  iVar2 = 10000;
  do {
    BORINGSSL_keccak_squeeze((BORINGSSL_keccak_st *)&local_f70,local_e88,0x40);
    BCM_mlkem768_generate_key_external_seed((uint8_t *)local_4d8,out_private_key,local_e88);
    MLKEM768_public_from_private(out_public_key,(MLKEM768_private_key *)out_private_key);
    BORINGSSL_keccak_absorb(&local_e40,(uint8_t *)local_4d8,0x4a0);
    Marshal<MLKEM768_private_key>
              (&local_1010,(_func_int_CBB_ptr_MLKEM768_private_key_ptr *)out_private_key,t);
    BORINGSSL_keccak_absorb
              (&local_e40,
               local_1010.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
               (long)local_1010.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_1010.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start);
    BORINGSSL_keccak_squeeze((BORINGSSL_keccak_st *)&local_f70,local_f98,0x20);
    BCM_mlkem768_encap_external_entropy
              ((uint8_t *)local_d58,local_fb8,(BCM_mlkem768_public_key *)out_public_key,local_f98);
    BORINGSSL_keccak_absorb(&local_e40,(uint8_t *)local_d58,0x440);
    BORINGSSL_keccak_absorb(&local_e40,local_fb8,0x20);
    BORINGSSL_keccak_squeeze((BORINGSSL_keccak_st *)&local_f70,(uint8_t *)local_918,0x440);
    iVar1 = MLKEM768_decap(local_fb8,(uint8_t *)local_918,0x440,
                           (MLKEM768_private_key *)out_private_key);
    local_1020[0] = (internal)(iVar1 != 0);
    local_1018 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_1028);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_ff8,local_1020,
                 (AssertionResult *)
                 "DECAP(shared_secret, invalid_ciphertext, sizeof(invalid_ciphertext), priv.get())",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_1030,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mlkem/mlkem_test.cc"
                 ,0x1e2,local_ff8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_1030,(Message *)&local_1028);
      testing::internal::AssertHelper::~AssertHelper(&local_1030);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_ff8._M_dataplus._M_p != &local_ff8.field_2) {
        operator_delete(local_ff8._M_dataplus._M_p,local_ff8.field_2._M_allocated_capacity + 1);
      }
      if (local_1028._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_1028._M_head_impl + 8))();
      }
      if (local_1018 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_1018,local_1018);
      }
      if (local_1010.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (uint8_t *)0x0) {
        operator_delete(local_1010.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_1010.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1010.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      goto LAB_00334af6;
    }
    BORINGSSL_keccak_absorb(&local_e40,local_fb8,0x20);
    if (local_1010.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uint8_t *)0x0) {
      operator_delete(local_1010.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_1010.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1010.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  BORINGSSL_keccak_squeeze(&local_e40,(uint8_t *)local_fd8,0x20);
LAB_00334af6:
  operator_delete(out_public_key,0x1840);
  operator_delete(out_private_key,0x1e60);
  local_4d8[0].line = 0x39dcf08;
  local_4d8[0]._20_4_ = 0xb250c1ed;
  local_4d8[0].message._M_dataplus._M_p = (pointer)0xc1c15bef0bb97cb0;
  local_4d8[0].type = 0x8dd159f9;
  local_4d8[0]._4_4_ = 0x1280113d;
  local_4d8[0].file = (char *)0x791ef1050ebf3314;
  local_918[0].span_.data_ = (uchar *)local_fd8;
  local_918[0].span_.size_ = 0x20;
  local_f70 = local_4d8;
  local_f68 = 0x20;
  testing::internal::CmpHelperEQ<Bytes,Bytes>
            (local_d58,"Bytes(result)","Bytes(kExpected)",local_918,(Bytes *)&local_f70);
  if (local_d58[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_918);
    if (local_d50[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_d50[0]->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mlkem/mlkem_test.cc"
               ,0x1fb,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f70,(Message *)local_918);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f70);
    if ((long *)local_918[0].span_.data_ != (long *)0x0) {
      (**(code **)(*(long *)local_918[0].span_.data_ + 8))();
    }
  }
  if (local_d50[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_d50,local_d50[0]);
  }
  return;
}

Assistant:

TEST(MLKEMTest, Iterate768) {
  // The structure of this test is taken from
  // https://github.com/C2SP/CCTV/blob/main/ML-KEM/README.md?ref=words.filippo.io#accumulated-pq-crystals-vectors
  // but the final value has been updated to reflect the change from Kyber to
  // ML-KEM.
  uint8_t result[32];
  IteratedTest<MLKEM768_public_key, MLKEM768_PUBLIC_KEY_BYTES,
               MLKEM768_private_key, BCM_MLKEM768_PRIVATE_KEY_BYTES,
               wrapper_768_generate_key_external_seed,
               MLKEM768_public_from_private, wrapper_768_marshal_private_key,
               MLKEM768_CIPHERTEXT_BYTES, wrapper_768_encap_external_entropy,
               MLKEM768_decap>(result);

  const uint8_t kExpected[32] = {
      0xf9, 0x59, 0xd1, 0x8d, 0x3d, 0x11, 0x80, 0x12, 0x14, 0x33, 0xbf,
      0x0e, 0x05, 0xf1, 0x1e, 0x79, 0x08, 0xcf, 0x9d, 0x03, 0xed, 0xc1,
      0x50, 0xb2, 0xb0, 0x7c, 0xb9, 0x0b, 0xef, 0x5b, 0xc1, 0xc1};
  EXPECT_EQ(Bytes(result), Bytes(kExpected));
}